

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall QSortFilterProxyModel::setSortRole(QSortFilterProxyModel *this,int role)

{
  parameter_type pVar1;
  QSortFilterProxyModelPrivate *pQVar2;
  int in_ESI;
  QSortFilterProxyModelPrivate *d;
  QSortFilterProxyModelPrivate *in_stack_00000038;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
  *in_stack_00000070;
  
  pQVar2 = d_func((QSortFilterProxyModel *)0x8799cb);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
              *)d);
  pVar1 = QPropertyData<int>::valueBypassingBindings(&(pQVar2->sort_role).super_QPropertyData<int>);
  if (pVar1 != in_ESI) {
    QPropertyData<int>::setValueBypassingBindings
              (&(pQVar2->sort_role).super_QPropertyData<int>,in_ESI);
    QSortFilterProxyModelPrivate::sort(in_stack_00000038);
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>
    ::notify(in_stack_00000070);
  }
  return;
}

Assistant:

void QSortFilterProxyModel::setSortRole(int role)
{
    Q_D(QSortFilterProxyModel);
    d->sort_role.removeBindingUnlessInWrapper();
    if (d->sort_role.valueBypassingBindings() == role)
        return;
    d->sort_role.setValueBypassingBindings(role);
    d->sort();
    d->sort_role.notify(); // also emits a signal
}